

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>
::~BuiltinPrecisionCaseTestInstance
          (BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>
           *this)

{
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_tcu::Vector<float,_2>_>_>
  *this_local;
  
  ~BuiltinPrecisionCaseTestInstance(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

BuiltinPrecisionCaseTestInstance	(Context&						context,
																		 const CaseContext				caseCtx,
																		 const ShaderSpec&				shaderSpec,
																		 const Variables<In, Out>		variables,
																		 const Samplings<In>&			samplings,
																		 const StatementP				stmt)
										: TestInstance	(context)
										, m_caseCtx		(caseCtx)
										, m_variables	(variables)
										, m_samplings	(samplings)
										, m_stmt		(stmt)
										, m_executor	(createExecutor(context, caseCtx.shaderType, shaderSpec))
									{
									}